

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

optional<slang::TimeScale> __thiscall slang::ast::Scope::getTimeScale(Scope *this)

{
  SymbolKind SVar1;
  optional<slang::TimeScale> oVar2;
  Symbol *this_00;
  CompilationUnitSymbol *pCVar3;
  PackageSymbol *pPVar4;
  InstanceBodySymbol *this_01;
  DefinitionSymbol *pDVar5;
  Compilation *this_02;
  Scope *in_RDI;
  Symbol *sym;
  Scope *current;
  Scope *local_18;
  _Storage<slang::TimeScale,_true> local_5;
  bool local_1;
  
  local_18 = in_RDI;
  do {
    this_00 = asSymbol(local_18);
    SVar1 = this_00->kind;
    if (SVar1 == CompilationUnit) {
      pCVar3 = Symbol::as<slang::ast::CompilationUnitSymbol>((Symbol *)0x757ac9);
      local_5 = (pCVar3->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>._M_payload;
      local_1 = (pCVar3->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>._M_engaged;
      goto LAB_00757b58;
    }
    if (SVar1 == InstanceBody) {
      this_01 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x757b03);
      pDVar5 = InstanceBodySymbol::getDefinition(this_01);
      local_5 = (pDVar5->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>._M_payload;
      local_1 = (pDVar5->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>._M_engaged;
      goto LAB_00757b58;
    }
    if (SVar1 == Package) {
      pPVar4 = Symbol::as<slang::ast::PackageSymbol>((Symbol *)0x757ae3);
      local_5 = (pPVar4->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>._M_payload;
      local_1 = (pPVar4->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>._M_engaged;
      goto LAB_00757b58;
    }
    local_18 = Symbol::getParentScope(this_00);
  } while (local_18 != (Scope *)0x0);
  this_02 = getCompilation(in_RDI);
  oVar2 = Compilation::getDefaultTimeScale(this_02);
  local_5 = oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_1 = oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_engaged;
LAB_00757b58:
  oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = local_1;
  oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = local_5;
  return (optional<slang::TimeScale>)
         oVar2.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
         super__Optional_payload_base<slang::TimeScale>;
}

Assistant:

std::optional<TimeScale> Scope::getTimeScale() const {
    const Scope* current = this;
    do {
        auto& sym = current->asSymbol();
        switch (sym.kind) {
            case SymbolKind::CompilationUnit:
                return sym.as<CompilationUnitSymbol>().timeScale;
            case SymbolKind::Package:
                return sym.as<PackageSymbol>().timeScale;
            case SymbolKind::InstanceBody:
                return sym.as<InstanceBodySymbol>().getDefinition().timeScale;
            default:
                current = sym.getParentScope();
                break;
        }
    } while (current);

    return getCompilation().getDefaultTimeScale();
}